

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  size_t sVar1;
  uint uVar2;
  CURLMcode CVar3;
  char *ptr;
  size_t len;
  uint uVar4;
  uint uVar5;
  tempbuf writebuf [3];
  uint local_38;
  uint count;
  uint i;
  int newstate;
  int oldstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  newstate = 0;
  if (((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) ||
     (data->conn == (connectdata *)0x0)) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    uVar4 = 0;
    if ((action & 1U) != 0) {
      uVar4 = 0x10;
    }
    uVar5 = 0;
    if ((action & 4U) != 0) {
      uVar5 = 0x20;
    }
    uVar2 = (data->req).keepon & 0xffffffcfU | uVar4 | uVar5;
    if ((uVar4 | uVar5) == ((data->req).keepon & 0x30U)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if (((((data->req).keepon & (uVar2 ^ 0xffffffff) & 0x20) != 0) &&
          ((data->mstate == MSTATE_PERFORMING || (data->mstate == MSTATE_RATELIMITING)))) &&
         ((data->state).fread_func == Curl_mime_read)) {
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar2;
      if ((uVar4 == 0) && (Curl_http2_stream_pause(data,false), (data->state).tempcount != 0)) {
        writebuf[2]._36_4_ = (data->state).tempcount;
        for (local_38 = 0; local_38 < (data->state).tempcount; local_38 = local_38 + 1) {
          memcpy(&writebuf[(ulong)local_38 - 1].type,(data->state).tempwrite + local_38,0x28);
          Curl_dyn_init(&(data->state).tempwrite[local_38].b,0x4000000);
        }
        (data->state).tempcount = 0;
        for (local_38 = 0; local_38 < (uint)writebuf[2]._36_4_; local_38 = local_38 + 1) {
          if (newstate == 0) {
            sVar1 = writebuf[local_38].b.toobig;
            ptr = Curl_dyn_ptr((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
            len = Curl_dyn_len((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
            newstate = Curl_client_write(data,(int)sVar1,ptr,len);
          }
          Curl_dyn_free((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
        }
        if (newstate != 0) {
          return newstate;
        }
      }
      if ((uVar4 | uVar5) != 0x30) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        (data->state).keeps_speed.tv_sec = 0;
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if ((data->multi != (Curl_multi *)0x0) &&
           (CVar3 = Curl_update_timer(data->multi), CVar3 != CURLM_OK)) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      if ((*(uint *)&(data->state).field_0x6d0 >> 0xb & 1) == 0) {
        newstate = Curl_updatesocket(data);
      }
      data_local._4_4_ = newstate;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == MSTATE_PERFORMING ||
      data->mstate == MSTATE_RATELIMITING) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(data, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      if(result)
        return result;
    }
  }

#ifdef USE_HYPER
  if(!(newstate & KEEP_SEND_PAUSE)) {
    /* need to wake the send body waker */
    if(data->hyp.send_body_waker) {
      hyper_waker_wake(data->hyp.send_body_waker);
      data->hyp.send_body_waker = NULL;
    }
  }
#endif

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi) {
      if(Curl_update_timer(data->multi))
        return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  return result;
}